

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O3

wchar_t * do_hvis(wchar_t *dst,wint_t c,wchar_t flags,wint_t nextc,wchar_t *extra)

{
  int iVar1;
  wchar_t *pwVar2;
  
  iVar1 = iswalnum(c);
  if (((iVar1 == 0) && (7 < c - 0x27)) &&
     ((0x3e < c - 0x21 || ((0x4000000000000009U >> ((ulong)(c - 0x21) & 0x3f) & 1) == 0)))) {
    *dst = L'%';
    dst[1] = *(wchar_t *)((long)L"0123456789abcdef" + (ulong)(c >> 2 & 0x3c));
    dst[2] = L"0123456789abcdef"[c & 0xf];
    return dst + 3;
  }
  pwVar2 = do_svis(dst,c,flags,nextc,extra);
  return pwVar2;
}

Assistant:

static wchar_t *
do_hvis(wchar_t *dst, wint_t c, int flags, wint_t nextc, const wchar_t *extra)
{
	if (iswalnum(c)
	    /* safe */
	    || c == L'$' || c == L'-' || c == L'_' || c == L'.' || c == L'+'
	    /* extra */
	    || c == L'!' || c == L'*' || c == L'\'' || c == L'(' || c == L')'
	    || c == L',')
		dst = do_svis(dst, c, flags, nextc, extra);
	else {
		*dst++ = L'%';
		*dst++ = xtoa(((unsigned int)c >> 4) & 0xf);
		*dst++ = xtoa((unsigned int)c & 0xf);
	}

	return dst;
}